

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcFeatureElementSubtraction *in;
  
  in = (IfcFeatureElementSubtraction *)operator_new(0x170);
  *(undefined ***)&(in->super_IfcFeatureElement).field_0x158 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x160 = 0;
  *(char **)&in->field_0x168 = "IfcFeatureElementSubtraction";
  Assimp::IFC::Schema_2x3::IfcFeatureElement::IfcFeatureElement
            ((IfcFeatureElement *)in,&PTR_construction_vtable_24__008310f8);
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject =
       &PTR__IfcFeatureElementSubtraction_00830fc8;
  *(undefined ***)&(in->super_IfcFeatureElement).field_0x158 =
       &PTR__IfcFeatureElementSubtraction_008310e0;
  *(undefined ***)
   &(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       &PTR__IfcFeatureElementSubtraction_00830ff0;
  (in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFeatureElementSubtraction_00831018;
  *(undefined ***)
   &(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       &PTR__IfcFeatureElementSubtraction_00831040;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.field_0x100 =
       &PTR__IfcFeatureElementSubtraction_00831068;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.field_0x138 =
       &PTR__IfcFeatureElementSubtraction_00831090;
  *(undefined ***)&(in->super_IfcFeatureElement).super_IfcElement.field_0x148 =
       &PTR__IfcFeatureElementSubtraction_008310b8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>(db,params,in);
  return (Object *)
         (&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x0
         + *(long *)(*(long *)&(in->super_IfcFeatureElement).super_IfcElement.super_IfcProduct.
                               super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }